

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_address.cpp
# Opt level: O3

int CfdCreateConfidentialAddress
              (void *handle,char *address,char *confidential_key,char **confidential_address)

{
  string **ppsVar1;
  bool bVar2;
  char *pcVar3;
  CfdException *pCVar4;
  Pubkey key;
  ElementsAddressFactory factory;
  ElementsConfidentialAddress confidential_addr;
  Address addr;
  Pubkey local_548;
  AddressFactory local_530;
  ElementsConfidentialAddress local_508;
  Address local_358;
  ElementsConfidentialAddress local_1e0;
  
  cfd::Initialize();
  if (confidential_address == (char **)0x0) {
    local_508.unblinded_address_._0_8_ = "cfdcapi_elements_address.cpp";
    local_508.unblinded_address_.witness_ver_ = 0x49;
    local_508.unblinded_address_.address_._M_dataplus._M_p = "CfdCreateConfidentialAddress";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)&local_508,kCfdLogLevelWarning,"confidential address is null.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    local_508.unblinded_address_._0_8_ = &local_508.unblinded_address_.address_;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_508,"Failed to parameter. confidential address is null.","");
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&local_508);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar2 = cfd::capi::IsEmptyString(address);
  if (!bVar2) {
    bVar2 = cfd::capi::IsEmptyString(confidential_key);
    if (!bVar2) {
      cfd::ElementsAddressFactory::ElementsAddressFactory((ElementsAddressFactory *)&local_530);
      std::__cxx11::string::string((string *)&local_508,address,(allocator *)&local_1e0);
      cfd::AddressFactory::GetAddress(&local_358,&local_530,(string *)&local_508);
      ppsVar1 = (string **)&local_508.unblinded_address_.address_;
      if ((string **)local_508.unblinded_address_._0_8_ != ppsVar1) {
        operator_delete((void *)local_508.unblinded_address_._0_8_);
      }
      std::__cxx11::string::string((string *)&local_508,confidential_key,(allocator *)&local_1e0);
      cfd::core::Pubkey::Pubkey(&local_548,(string *)&local_508);
      if ((string **)local_508.unblinded_address_._0_8_ != ppsVar1) {
        operator_delete((void *)local_508.unblinded_address_._0_8_);
      }
      cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress(&local_508);
      cfd::ElementsAddressFactory::GetConfidentialAddress(&local_1e0,&local_358,&local_548);
      cfd::core::ElementsConfidentialAddress::operator=(&local_508,&local_1e0);
      cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress(&local_1e0);
      cfd::core::ElementsConfidentialAddress::GetAddress_abi_cxx11_((string *)&local_1e0,&local_508)
      ;
      pcVar3 = cfd::capi::CreateString((string *)&local_1e0);
      *confidential_address = pcVar3;
      if ((undefined1 **)local_1e0.unblinded_address_._0_8_ !=
          (undefined1 **)((long)&local_1e0 + 0x10U)) {
        operator_delete((void *)local_1e0.unblinded_address_._0_8_);
      }
      cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress(&local_508);
      if (local_548.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_548.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&local_358.format_data_);
      cfd::core::Script::~Script(&local_358.redeem_script_);
      local_358.script_tree_.super_TapBranch._vptr_TapBranch =
           (_func_int **)&PTR__TaprootScriptTree_0072eb30;
      std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                (&local_358.script_tree_.nodes_);
      cfd::core::TapBranch::~TapBranch(&local_358.script_tree_.super_TapBranch);
      if (local_358.schnorr_pubkey_.data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_358.schnorr_pubkey_.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_358.pubkey_.data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_358.pubkey_.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_358.hash_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_358.hash_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_358.address_._M_dataplus._M_p != &local_358.address_.field_2) {
        operator_delete(local_358.address_._M_dataplus._M_p);
      }
      local_530._vptr_AddressFactory = (_func_int **)&PTR__AddressFactory_007215c8;
      std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
      ~vector(&local_530.prefix_list_);
      return 0;
    }
    local_508.unblinded_address_._0_8_ = "cfdcapi_elements_address.cpp";
    local_508.unblinded_address_.witness_ver_ = 0x55;
    local_508.unblinded_address_.address_._M_dataplus._M_p = "CfdCreateConfidentialAddress";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)&local_508,kCfdLogLevelWarning,
               "confidential key is null or empty.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    local_508.unblinded_address_._0_8_ = &local_508.unblinded_address_.address_;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_508,"Failed to parameter. confidential key is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&local_508);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_508.unblinded_address_._0_8_ = "cfdcapi_elements_address.cpp";
  local_508.unblinded_address_.witness_ver_ = 0x4f;
  local_508.unblinded_address_.address_._M_dataplus._M_p = "CfdCreateConfidentialAddress";
  cfd::core::logger::log<>
            ((CfdSourceLocation *)&local_508,kCfdLogLevelWarning,"address is null or empty.");
  pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
  local_508.unblinded_address_._0_8_ = &local_508.unblinded_address_.address_;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_508,"Failed to parameter. address is null or empty.","");
  cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&local_508);
  __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdCreateConfidentialAddress(
    void* handle, const char* address, const char* confidential_key,
    char** confidential_address) {
  try {
    cfd::Initialize();
    if (confidential_address == nullptr) {
      warn(CFD_LOG_SOURCE, "confidential address is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. confidential address is null.");
    }
    if (IsEmptyString(address)) {
      warn(CFD_LOG_SOURCE, "address is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. address is null or empty.");
    }
    if (IsEmptyString(confidential_key)) {
      warn(CFD_LOG_SOURCE, "confidential key is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. confidential key is null or empty.");
    }

    ElementsAddressFactory factory;
    Address addr = factory.GetAddress(address);
    Pubkey key = Pubkey(confidential_key);

    ElementsConfidentialAddress confidential_addr;
    confidential_addr = factory.GetConfidentialAddress(addr, key);
    *confidential_address = CreateString(confidential_addr.GetAddress());

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}